

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O2

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkExpression(cmGeneratorExpressionDAGChecker *this)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  cmGeneratorExpressionDAGChecker *pcVar4;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  
  pcVar4 = Top(this);
  pcVar1 = (pcVar4->Property)._M_dataplus._M_p;
  sVar2 = (pcVar4->Property)._M_string_length;
  __y._M_str = "LINK_DIRECTORIES";
  __y._M_len = 0x10;
  __x._M_str = pcVar1;
  __x._M_len = sVar2;
  bVar3 = std::operator==(__x,__y);
  if (!bVar3) {
    __y_00._M_str = "LINK_OPTIONS";
    __y_00._M_len = 0xc;
    __x_00._M_str = pcVar1;
    __x_00._M_len = sVar2;
    bVar3 = std::operator==(__x_00,__y_00);
    if (!bVar3) {
      __y_01._M_str = "LINK_DEPENDS";
      __y_01._M_len = 0xc;
      __x_01._M_str = pcVar1;
      __x_01._M_len = sVar2;
      bVar3 = std::operator==(__x_01,__y_01);
      if (!bVar3) {
        __y_02._M_str = "LINK_LIBRARY_OVERRIDE";
        __y_02._M_len = 0x15;
        __x_02._M_str = pcVar1;
        __x_02._M_len = sVar2;
        bVar3 = std::operator==(__x_02,__y_02);
        return bVar3;
      }
    }
  }
  return true;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingLinkExpression() const
{
  cm::string_view property(this->Top()->Property);

  return property == "LINK_DIRECTORIES"_s || property == "LINK_OPTIONS"_s ||
    property == "LINK_DEPENDS"_s || property == "LINK_LIBRARY_OVERRIDE"_s;
}